

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O1

bool __thiscall
slang::ast::NamedValueExpression::checkConstant(NamedValueExpression *this,EvalContext *context)

{
  SymbolKind SVar1;
  size_type sVar2;
  pointer pFVar3;
  ValueSymbol *this_00;
  undefined8 uVar4;
  undefined4 uVar5;
  bool bVar6;
  optional<bool> oVar7;
  Diagnostic *pDVar8;
  Scope *pSVar9;
  Scope *pSVar10;
  LookupLocation target;
  
  if (((context->flags).m_bits & 1) != 0) {
    return true;
  }
  bVar6 = ValueExpressionBase::checkConstantBase(&this->super_ValueExpressionBase,context);
  if (bVar6) {
    sVar2 = (context->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.len;
    if (sVar2 == 0) {
      return true;
    }
    pFVar3 = (context->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_;
    if (pFVar3[sVar2 - 1].subroutine == (SubroutineSymbol *)0x0) {
      return true;
    }
    this_00 = (this->super_ValueExpressionBase).symbol;
    SVar1 = (this_00->super_Symbol).kind;
    if ((SVar1 == EnumValue) || (SVar1 == Parameter)) {
      uVar4 = pFVar3[sVar2 - 1].lookupLocation.scope;
      uVar5 = pFVar3[sVar2 - 1].lookupLocation.index;
      target.index = uVar5;
      target.scope = (Scope *)uVar4;
      target._12_4_ = 0;
      oVar7 = Symbol::isDeclaredBefore(&this_00->super_Symbol,target);
      if (((ushort)oVar7.super__Optional_base<bool,_true,_true>._M_payload.
                   super__Optional_payload_base<bool> & 1) != 0 ||
          ((ushort)oVar7.super__Optional_base<bool,_true,_true>._M_payload.
                   super__Optional_payload_base<bool> >> 8 & 1) == 0) {
        return true;
      }
      pSVar10 = (((this->super_ValueExpressionBase).symbol)->super_Symbol).parentScope;
      if (((pSVar10 != (Scope *)0x0) && (pSVar10->thisSym->kind == Package)) &&
         (pSVar10 != pFVar3[sVar2 - 1].lookupLocation.scope)) {
        return true;
      }
      pDVar8 = EvalContext::addDiag
                         (context,(DiagCode)0x10000c,
                          (this->super_ValueExpressionBase).super_Expression.sourceRange);
      pDVar8 = Diagnostic::operator<<
                         (pDVar8,(((this->super_ValueExpressionBase).symbol)->super_Symbol).name);
    }
    else {
      pSVar9 = &(pFVar3[sVar2 - 1].subroutine)->super_Scope;
      for (pSVar10 = (this_00->super_Symbol).parentScope;
          (pSVar10 != (Scope *)0x0 && (pSVar10 != pSVar9)); pSVar10 = pSVar10->thisSym->parentScope)
      {
      }
      if (pSVar10 == pSVar9) {
        return true;
      }
      pDVar8 = EvalContext::addDiag
                         (context,(DiagCode)0xd000c,
                          (this->super_ValueExpressionBase).super_Expression.sourceRange);
    }
    Diagnostic::addNote(pDVar8,(DiagCode)0x50001,
                        (((this->super_ValueExpressionBase).symbol)->super_Symbol).location);
  }
  return false;
}

Assistant:

bool NamedValueExpression::checkConstant(EvalContext& context) const {
    if (context.flags.has(EvalFlags::IsScript))
        return true;

    if (!checkConstantBase(context))
        return false;

    if (!context.inFunction())
        return true;

    const EvalContext::Frame& frame = context.topFrame();
    const SubroutineSymbol* subroutine = frame.subroutine;
    if (!subroutine)
        return true;

    // Constant functions have a bunch of additional restrictions. See [13.4.4]:
    // - All parameter values used within the function shall be defined before the use of
    //   the invoking constant function call.
    // - All identifiers that are not parameters or functions shall be declared locally to
    //   the current function.
    if (symbol.kind != SymbolKind::Parameter && symbol.kind != SymbolKind::EnumValue) {
        const Scope* scope = symbol.getParentScope();
        while (scope && scope != subroutine)
            scope = scope->asSymbol().getParentScope();

        if (scope != subroutine) {
            auto& diag = context.addDiag(diag::ConstEvalFunctionIdentifiersMustBeLocal,
                                         sourceRange);
            diag.addNote(diag::NoteDeclarationHere, symbol.location);
            return false;
        }
    }
    else {
        // Check whether the referenced parameter is declared prior to the invocation
        // of the constant function. If the two locations are not in the same compilation
        // unit, assume that it's ok. Also if the reference is via a package import
        // that's fine too.
        auto compare = symbol.isDeclaredBefore(frame.lookupLocation);
        if (!compare.value_or(true)) {
            auto scope = symbol.getParentScope();
            if (!scope || scope->asSymbol().kind != SymbolKind::Package ||
                scope == frame.lookupLocation.getScope()) {

                auto& diag = context.addDiag(diag::ConstEvalIdUsedInCEBeforeDecl, sourceRange)
                             << symbol.name;
                diag.addNote(diag::NoteDeclarationHere, symbol.location);
                return false;
            }
        }
    }

    return true;
}